

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smooth_test.cpp
# Opt level: O0

void __thiscall Smooth_Mirrored_Test::~Smooth_Mirrored_Test(Smooth_Mirrored_Test *this)

{
  Smooth_Mirrored_Test *this_local;
  
  ~Smooth_Mirrored_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Smooth, Mirrored) {
  const auto tet = Manifold::Tetrahedron().Scale({1, 2, 3}).GetMeshGL();
  Manifold smooth = Manifold::Smooth(tet);
  Manifold mirror = smooth.Scale({-2, 2, 2}).Refine(10);
  smooth = smooth.Refine(10).Scale({2, 2, 2});

  EXPECT_NEAR(smooth.Volume(), mirror.Volume(), 0.1);
  EXPECT_NEAR(smooth.SurfaceArea(), mirror.SurfaceArea(), 0.1);

#ifdef MANIFOLD_EXPORT
  if (options.exportModels)
    ExportMesh("smoothMirrored.glb", mirror.GetMeshGL(), {});
#endif
}